

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceManager::selectedShortRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  RigidBody *pRVar3;
  pointer ppAVar4;
  long lVar5;
  Snapshot *this_00;
  double dVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int iVar9;
  Inversion *pIVar10;
  ulong uVar11;
  Bond *pBVar12;
  pointer ppBVar13;
  pointer ppTVar14;
  pointer ppIVar15;
  pointer ppRVar16;
  pointer ppBVar17;
  RealType angle;
  double local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  Molecule *local_100;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_f8;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_f0;
  _Base_ptr local_e8;
  double local_e0;
  double local_d8;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_d0;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  potVec local_68;
  
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  ppRVar16 = (mol1->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = mol2;
  if (ppRVar16 !=
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar3 = *ppRVar16;
    while (pRVar3 != (RigidBody *)0x0) {
      ppRVar16 = ppRVar16 + 1;
      RigidBody::updateAtoms(pRVar3);
      if (ppRVar16 ==
          (mol1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      pRVar3 = *ppRVar16;
    }
  }
  ppBVar17 = (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_d8 = 0.0;
  local_118 = 0.0;
  local_e0 = 0.0;
  if (ppBVar17 !=
      (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar12 = *ppBVar17;
    local_118 = 0.0;
    local_e0 = 0.0;
    if (pBVar12 != (Bond *)0x0) {
      local_118 = 0.0;
      local_e0 = 0.0;
      do {
        ppBVar17 = ppBVar17 + 1;
        Bond::calcForce(pBVar12,this->doParticlePot_);
        if (this->doPotentialSelection_ == true) {
          ppAVar4 = (pBVar12->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) goto LAB_00211aff;
          }
          local_118 = local_118 + pBVar12->potential_;
        }
LAB_00211aff:
        local_e0 = local_e0 + pBVar12->potential_;
      } while ((ppBVar17 !=
                (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) &&
              (pBVar12 = *ppBVar17, pBVar12 != (Bond *)0x0));
    }
  }
  ppBVar13 = (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ppBVar13 !=
       (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pIVar10 = (Inversion *)*ppBVar13, pIVar10 != (Inversion *)0x0)) {
    local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                *)&this->bendDataSets;
    p_Var1 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_d8 = 0.0;
    do {
      (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar10,&local_110,(ulong)this->doParticlePot_);
      local_e8 = (_Base_ptr)pIVar10->inversionType_;
      p_Var8 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_00211bbe:
        local_d0.second.deltaV = 0.0;
        local_d0.second.prev.angle = (RealType)local_110;
        local_d0.second.curr.angle = (RealType)local_110;
        local_d0.first = pIVar10;
        local_d0.second.prev.potential = (RealType)local_e8;
        local_d0.second.curr.potential = (RealType)local_e8;
        std::
        _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                  (local_f0,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_d0);
      }
      else {
        do {
          if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (pIVar10 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_00211bbe;
        dVar6 = *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20);
        *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 8) =
             *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18);
        *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x10) = dVar6;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18) = local_110;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20) = local_e8;
        *(double *)((long)p_Var7 + 0x28) = ABS((double)local_e8 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) goto LAB_00211cdb;
          }
        }
        local_118 = local_118 + (double)pIVar10->inversionType_;
      }
LAB_00211cdb:
      local_d8 = local_d8 + (double)local_e8;
      ppBVar13 = ppBVar13 + 1;
    } while ((ppBVar13 !=
              (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) &&
            (pIVar10 = (Inversion *)*ppBVar13, pIVar10 != (Inversion *)0x0));
  }
  ppTVar14 = (mol1->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_e8 = (_Base_ptr)0x0;
  if (ppTVar14 ==
      (mol1->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                *)0x0;
  }
  else {
    pIVar10 = (Inversion *)*ppTVar14;
    if (pIVar10 == (Inversion *)0x0) {
      local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                  *)0x0;
    }
    else {
      local_a0 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                  *)&this->torsionDataSets;
      local_f8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                  *)&(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
      local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                  *)0x0;
      do {
        (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar10,&local_110,(ulong)this->doParticlePot_);
        local_108 = *(_Base_ptr *)((long)&(pIVar10->name_).field_2 + 8);
        p_Var8 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = (_Base_ptr)local_f8;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_00211ded:
          local_d0.second.deltaV = 0.0;
          local_d0.second.prev.angle = (RealType)local_110;
          local_d0.second.curr.angle = (RealType)local_110;
          local_d0.first = pIVar10;
          local_d0.second.prev.potential = (RealType)local_108;
          local_d0.second.curr.potential = (RealType)local_108;
          std::
          _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                    (local_a0,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_d0);
        }
        else {
          do {
            if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
              p_Var7 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var7 == (_Base_ptr)local_f8) || (pIVar10 < *(Inversion **)((long)p_Var7 + 0x20)))
          goto LAB_00211ded;
          p_Var8 = *(_Base_ptr *)((long)p_Var7 + 0x48);
          *(_Base_ptr *)((long)p_Var7 + 0x30) = *(_Base_ptr *)((long)p_Var7 + 0x40);
          *(_Base_ptr *)((long)p_Var7 + 0x38) = p_Var8;
          *(_Base_ptr *)((long)p_Var7 + 0x40) = local_110;
          *(_Base_ptr *)((long)p_Var7 + 0x48) = local_108;
          *(double *)((long)p_Var7 + 0x28) = ABS((double)local_108 - (double)p_Var8);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar9 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar9 = iVar2;
              }
              if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) {
                iVar2 = (ppAVar4[3]->super_StuntDouble).globalIndex_;
                uVar11 = (ulong)iVar2;
                iVar9 = iVar2 + 0x3f;
                if (-1 < (long)uVar11) {
                  iVar9 = iVar2;
                }
                if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar11 & 0x3f) & 1) == 0) goto LAB_00211f46;
              }
            }
          }
          local_118 = local_118 + *(double *)((long)&(pIVar10->name_).field_2 + 8);
        }
LAB_00211f46:
        local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                    *)((double)local_f0 + (double)local_108);
        ppTVar14 = ppTVar14 + 1;
      } while ((ppTVar14 !=
                (mol1->torsions_).
                super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                super__Vector_impl_data._M_finish) &&
              (pIVar10 = (Inversion *)*ppTVar14, pIVar10 != (Inversion *)0x0));
    }
  }
  ppIVar15 = (mol1->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppIVar15 !=
       (mol1->inversions_).
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pIVar10 = *ppIVar15, pIVar10 != (Inversion *)0x0)) {
    local_a0 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&this->inversionDataSets;
    local_f8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_e8 = (_Base_ptr)0x0;
    do {
      (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar10,&local_110,(ulong)this->doParticlePot_);
      local_108 = (_Base_ptr)pIVar10->potential_;
      p_Var8 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = (_Base_ptr)local_f8;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_0021205a:
        local_d0.second.deltaV = 0.0;
        local_d0.second.prev.angle = (RealType)local_110;
        local_d0.second.curr.angle = (RealType)local_110;
        local_d0.first = pIVar10;
        local_d0.second.prev.potential = (RealType)local_108;
        local_d0.second.curr.potential = (RealType)local_108;
        std::
        _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                  ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                    *)local_a0,&local_d0);
      }
      else {
        do {
          if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if ((p_Var7 == (_Base_ptr)local_f8) || (pIVar10 < *(Inversion **)((long)p_Var7 + 0x20)))
        goto LAB_0021205a;
        p_Var8 = *(_Base_ptr *)((long)p_Var7 + 0x48);
        *(_Base_ptr *)((long)p_Var7 + 0x30) = *(_Base_ptr *)((long)p_Var7 + 0x40);
        *(_Base_ptr *)((long)p_Var7 + 0x38) = p_Var8;
        *(_Base_ptr *)((long)p_Var7 + 0x40) = local_110;
        *(_Base_ptr *)((long)p_Var7 + 0x48) = local_108;
        *(double *)((long)p_Var7 + 0x28) = ABS((double)local_108 - (double)p_Var8);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar4[3]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar9 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar9 = iVar2;
              }
              if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) goto LAB_002121aa;
            }
          }
        }
        local_118 = local_118 + pIVar10->potential_;
      }
LAB_002121aa:
      local_e8 = (_Base_ptr)((double)local_e8 + (double)local_108);
      ppIVar15 = ppIVar15 + 1;
    } while ((ppIVar15 !=
              (mol1->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_finish) &&
            (pIVar10 = *ppIVar15, pIVar10 != (Inversion *)0x0));
  }
  ppRVar16 = (local_100->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar16 !=
      (local_100->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar3 = *ppRVar16;
    while (pRVar3 != (RigidBody *)0x0) {
      ppRVar16 = ppRVar16 + 1;
      RigidBody::updateAtoms(pRVar3);
      if (ppRVar16 ==
          (local_100->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      pRVar3 = *ppRVar16;
    }
  }
  ppBVar17 = (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar17 !=
      (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pBVar12 = *ppBVar17;
    while (pBVar12 != (Bond *)0x0) {
      ppBVar17 = ppBVar17 + 1;
      Bond::calcForce(pBVar12,this->doParticlePot_);
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pBVar12->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) goto LAB_00212335;
        }
        local_118 = local_118 + pBVar12->potential_;
      }
LAB_00212335:
      local_e0 = local_e0 + pBVar12->potential_;
      if (ppBVar17 ==
          (local_100->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) break;
      pBVar12 = *ppBVar17;
    }
  }
  ppBVar13 = (local_100->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((ppBVar13 !=
       (local_100->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     (pIVar10 = (Inversion *)*ppBVar13, pIVar10 != (Inversion *)0x0)) {
    p_Var1 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar10,&local_110,(ulong)this->doParticlePot_);
      local_108 = (_Base_ptr)pIVar10->inversionType_;
      p_Var8 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_002123ef:
        local_d0.second.deltaV = 0.0;
        local_d0.second.prev.angle = (RealType)local_110;
        local_d0.second.curr.angle = (RealType)local_110;
        local_d0.first = pIVar10;
        local_d0.second.prev.potential = (RealType)local_108;
        local_d0.second.curr.potential = (RealType)local_108;
        std::
        _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                  ((_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                    *)&this->bendDataSets,
                   (pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_d0);
      }
      else {
        do {
          if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (pIVar10 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_002123ef;
        dVar6 = *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20);
        *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 8) =
             *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18);
        *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x10) = dVar6;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18) = local_110;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20) = local_108;
        *(double *)((long)p_Var7 + 0x28) = ABS((double)local_108 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) goto LAB_0021250a;
          }
        }
        local_118 = local_118 + (double)pIVar10->inversionType_;
      }
LAB_0021250a:
      local_d8 = local_d8 + (double)local_108;
      ppBVar13 = ppBVar13 + 1;
    } while ((ppBVar13 !=
              (local_100->bends_).
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_finish) &&
            (pIVar10 = (Inversion *)*ppBVar13, pIVar10 != (Inversion *)0x0));
  }
  ppTVar14 = (local_100->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppTVar14 !=
       (local_100->torsions_).
       super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pIVar10 = (Inversion *)*ppTVar14, pIVar10 != (Inversion *)0x0)) {
    local_f8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&this->torsionDataSets;
    p_Var1 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar10,&local_110,(ulong)this->doParticlePot_);
      local_108 = *(_Base_ptr *)((long)&(pIVar10->name_).field_2 + 8);
      p_Var8 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_00212607:
        local_d0.second.deltaV = 0.0;
        local_d0.second.prev.angle = (RealType)local_110;
        local_d0.second.curr.angle = (RealType)local_110;
        local_d0.first = pIVar10;
        local_d0.second.prev.potential = (RealType)local_108;
        local_d0.second.curr.potential = (RealType)local_108;
        std::
        _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                  (local_f8,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_d0);
      }
      else {
        do {
          if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (pIVar10 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_00212607;
        dVar6 = *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20);
        *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 8) =
             *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18);
        *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x10) = dVar6;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18) = local_110;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20) = local_108;
        *(double *)((long)p_Var7 + 0x28) = ABS((double)local_108 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar4[3]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar9 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar9 = iVar2;
              }
              if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) goto LAB_00212757;
            }
          }
        }
        local_118 = local_118 + *(double *)((long)&(pIVar10->name_).field_2 + 8);
      }
LAB_00212757:
      local_f0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                  *)((double)local_f0 + (double)local_108);
      ppTVar14 = ppTVar14 + 1;
    } while ((ppTVar14 !=
              (local_100->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_finish) &&
            (pIVar10 = (Inversion *)*ppTVar14, pIVar10 != (Inversion *)0x0));
  }
  ppIVar15 = (local_100->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppIVar15 !=
       (local_100->inversions_).
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pIVar10 = *ppIVar15, pIVar10 != (Inversion *)0x0)) {
    local_f8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&this->inversionDataSets;
    p_Var1 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    do {
      (*(pIVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (pIVar10,&local_110,(ulong)this->doParticlePot_);
      local_108 = (_Base_ptr)pIVar10->potential_;
      p_Var8 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_00212854:
        local_d0.second.deltaV = 0.0;
        local_d0.second.prev.angle = (RealType)local_110;
        local_d0.second.curr.angle = (RealType)local_110;
        local_d0.first = pIVar10;
        local_d0.second.prev.potential = (RealType)local_108;
        local_d0.second.curr.potential = (RealType)local_108;
        std::
        _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                  ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                    *)local_f8,&local_d0);
      }
      else {
        do {
          if (*(Inversion **)(p_Var8 + 1) >= pIVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Inversion **)(p_Var8 + 1) < pIVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (pIVar10 < (Inversion *)((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_00212854;
        dVar6 = *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20);
        *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 8) =
             *(undefined8 *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18);
        *(double *)((undefined1 *)((long)p_Var7 + 0x28) + 0x10) = dVar6;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x18) = local_110;
        *(_Base_ptr *)((undefined1 *)((long)p_Var7 + 0x28) + 0x20) = local_108;
        *(double *)((long)p_Var7 + 0x28) = ABS((double)local_108 - dVar6);
      }
      if (this->doPotentialSelection_ == true) {
        ppAVar4 = (pIVar10->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = ((*ppAVar4)->super_StuntDouble).globalIndex_;
        uVar11 = (ulong)iVar2;
        iVar9 = iVar2 + 0x3f;
        if (-1 < (long)uVar11) {
          iVar9 = iVar2;
        }
        lVar5 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>;
        if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                       (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
             (uVar11 & 0x3f) & 1) == 0) {
          iVar2 = (ppAVar4[1]->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar9 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar9 = iVar2;
          }
          if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar4[2]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar9 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar9 = iVar2;
            }
            if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar4[3]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar9 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar9 = iVar2;
              }
              if ((*(ulong *)(lVar5 + (long)(iVar9 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) goto LAB_002129a4;
            }
          }
        }
        local_118 = local_118 + pIVar10->potential_;
      }
LAB_002129a4:
      local_e8 = (_Base_ptr)((double)local_e8 + (double)local_108);
      ppIVar15 = ppIVar15 + 1;
    } while ((ppIVar15 !=
              (local_100->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_finish) &&
            (pIVar10 = *ppIVar15, pIVar10 != (Inversion *)0x0));
  }
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::setBondPotential(this_00,local_e0);
  Snapshot::setBendPotential(this_00,local_d8);
  Snapshot::setTorsionPotential(this_00,(RealType)local_f0);
  Snapshot::setInversionPotential(this_00,(RealType)local_e8);
  local_68.data_[4] = local_78;
  local_68.data_[5] = dStack_70;
  local_68.data_[2] = local_88;
  local_68.data_[3] = dStack_80;
  local_68.data_[0] = local_98;
  local_68.data_[1] = dStack_90;
  local_68.data_[6] = local_118;
  Snapshot::setSelectionPotentials(this_00,&local_68);
  return;
}

Assistant:

void ForceManager::selectedShortRangeInteractions(Molecule* mol1,
                                                    Molecule* mol2) {
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // First compute for mol1
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol1->beginBond(bondIter); bond != NULL;
         bond = mol1->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol1->beginBend(bendIter); bend != NULL;
         bend = mol1->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol1->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol1->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol1->beginInversion(inversionIter); inversion != NULL;
         inversion = mol1->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

    // Next compute for mol2
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol2->beginBond(bondIter); bond != NULL;
         bond = mol2->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol2->beginBend(bendIter); bend != NULL;
         bend = mol2->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol2->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol2->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol2->beginInversion(inversionIter); inversion != NULL;
         inversion = mol2->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }